

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unicode.hpp
# Opt level: O1

void cppjieba::GetWordsFromWordRanges
               (string *s,vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *wrs,
               vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> *words)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  long lVar6;
  long lVar7;
  pointer pWVar8;
  ulong uVar9;
  long lVar10;
  Word local_80;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  pWVar8 = (wrs->super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((wrs->super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>)._M_impl.
      super__Vector_impl_data._M_finish != pWVar8) {
    lVar10 = 8;
    uVar9 = 0;
    do {
      lVar6 = *(long *)((long)pWVar8 + lVar10 + -8);
      lVar7 = *(long *)((long)&pWVar8->left + lVar10);
      if (*(uint *)(lVar7 + 4) < *(uint *)(lVar6 + 4)) {
        __assert_fail("right->offset >= left->offset",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/messense[P]cppjieba-cabi/cppjieba/include/cppjieba/Unicode.hpp"
                      ,0xc2,
                      "Word cppjieba::GetWordFromRunes(const string &, RuneStrArray::const_iterator, RuneStrArray::const_iterator)"
                     );
      }
      iVar1 = *(int *)(lVar7 + 0xc);
      iVar2 = *(int *)(lVar7 + 0x10);
      iVar3 = *(int *)(lVar6 + 0xc);
      std::__cxx11::string::substr((ulong)&local_50,(ulong)s);
      uVar4 = *(uint32_t *)(lVar6 + 4);
      uVar5 = *(uint32_t *)(lVar6 + 0xc);
      local_80.word._M_dataplus._M_p = (pointer)&local_80.word.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_80,local_50,local_50 + local_48);
      local_80.unicode_length = (iVar1 - iVar3) + iVar2;
      local_80.offset = uVar4;
      local_80.unicode_offset = uVar5;
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
      std::vector<cppjieba::Word,_std::allocator<cppjieba::Word>_>::emplace_back<cppjieba::Word>
                (words,&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80.word._M_dataplus._M_p != &local_80.word.field_2) {
        operator_delete(local_80.word._M_dataplus._M_p);
      }
      uVar9 = uVar9 + 1;
      pWVar8 = (wrs->super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>).
               _M_impl.super__Vector_impl_data._M_start;
      lVar10 = lVar10 + 0x10;
    } while (uVar9 < (ulong)((long)(wrs->
                                   super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pWVar8 >> 4))
    ;
  }
  return;
}

Assistant:

inline void GetWordsFromWordRanges(const string& s, const vector<WordRange>& wrs, vector<Word>& words) {
  for (size_t i = 0; i < wrs.size(); i++) {
    words.push_back(GetWordFromRunes(s, wrs[i].left, wrs[i].right));
  }
}